

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O3

int If_CluCountCofs4(word *pF,int nVars,int nBSsize,word (*pCofs) [256])

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  word iCofs [128];
  word local_428 [128];
  
  memset(local_428,0,0x400);
  if (pCofs == (word (*) [256])0x0) {
    __assert_fail("pCofs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x3d7,"int If_CluCountCofs4(word *, int, int, word (*)[256])");
  }
  iVar4 = nVars - nBSsize;
  if ((iVar4 == 0 || nVars < nBSsize) || (4 < nBSsize - 2U)) {
    __assert_fail("nBSsize >= 2 && nBSsize <= 6 && nBSsize < nVars",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x3d8,"int If_CluCountCofs4(word *, int, int, word (*)[256])");
  }
  if (5 < iVar4) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                  ,0x3f3,"int If_CluCountCofs4(word *, int, int, word (*)[256])");
  }
  uVar3 = 0;
  uVar7 = 0;
  uVar8 = 0;
  uVar1 = 0;
  do {
    uVar5 = (int)uVar3 << ((byte)iVar4 & 0x1f);
    uVar9 = pF[uVar5 >> 6] >> ((byte)uVar5 & 0x3f) &
            ~(-1L << ((byte)(1 << ((byte)iVar4 & 0x1f)) & 0x3f));
    uVar6 = 0;
    if ((int)uVar1 < 1) {
LAB_00417f31:
      uVar5 = (uint)uVar6;
      if (uVar5 == uVar1) goto LAB_00417f35;
    }
    else {
      uVar6 = 0;
      do {
        if (uVar9 == local_428[uVar6]) goto LAB_00417f31;
        uVar6 = uVar6 + 1;
        uVar5 = uVar1;
      } while (uVar1 != uVar6);
LAB_00417f35:
      lVar2 = (long)(int)uVar1;
      uVar1 = uVar1 + 1;
      local_428[lVar2] = uVar9;
    }
    uVar9 = 1L << ((byte)uVar3 & 0x3f);
    uVar6 = 0;
    if ((uVar5 & 0x7ffffffd) == 1) {
      uVar6 = uVar9;
    }
    uVar7 = uVar7 | uVar6;
    if ((uVar5 & 0x7ffffffe) != 2) {
      uVar9 = 0;
    }
    uVar8 = uVar8 | uVar9;
    uVar3 = uVar3 + 1;
    if (uVar3 == (uint)(1 << ((byte)nBSsize & 0x1f))) {
      if (1 < uVar1 - 3) {
        __assert_fail("nCofs >= 3 && nCofs <= 4",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                      ,0x3ea,"int If_CluCountCofs4(word *, int, int, word (*)[256])");
      }
      (*pCofs)[0] = local_428[0];
      pCofs[1][0] = local_428[1];
      pCofs[2][0] = local_428[2];
      if (uVar1 == 4) {
        local_428[2] = local_428[3];
      }
      pCofs[3][0] = local_428[2];
      pCofs[4][0] = uVar7;
      pCofs[5][0] = uVar8;
      return uVar1;
    }
  } while( true );
}

Assistant:

int If_CluCountCofs4( word * pF, int nVars, int nBSsize, word pCofs[6][CLU_WRD_MAX/4] )
{
    word iCofs[128] = {0}, iCof, Result0 = 0, Result1 = 0;
    int nMints = (1 << nBSsize);
    int i, c, nCofs = 0;
    assert( pCofs );
    assert( nBSsize >= 2 && nBSsize <= 6 && nBSsize < nVars );
    if ( nVars - nBSsize < 6 )
    {
        int nShift = (1 << (nVars - nBSsize));
        word Mask  = ((((word)1) << nShift) - 1);
        for ( nCofs = i = 0; i < nMints; i++ )
        {
            iCof = (pF[(i * nShift) / 64] >> ((i * nShift) & 63)) & Mask;
            for ( c = 0; c < nCofs; c++ )
                if ( iCof == iCofs[c] )
                    break;
            if ( c == nCofs )
                iCofs[nCofs++] = iCof;
            if ( c == 1 || c == 3 )
                Result0 |= (((word)1) << i);
            if ( c == 2 || c == 3 )
                Result1 |= (((word)1) << i);
        }
        assert( nCofs >= 3 && nCofs <= 4 );
        pCofs[0][0] = iCofs[0];
        pCofs[1][0] = iCofs[1];
        pCofs[2][0] = iCofs[2];
        pCofs[3][0] = (nCofs == 4) ? iCofs[3] : iCofs[2];
        pCofs[4][0] = Result0;
        pCofs[5][0] = Result1;
    }
    else
        assert( 0 );
    return nCofs;
}